

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

float Abc_BufComputeArr(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  
  uVar1 = (pObj->vFanins).nSize;
  if ((int)uVar1 < 1) {
    uVar4 = pObj->Id;
    fVar7 = -1e+09;
  }
  else {
    uVar4 = pObj->Id;
    if (((long)(int)uVar4 < 0) || (p->vOffsets->nSize <= (int)uVar4)) {
LAB_0045551b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar2 = p->vOffsets->pArray[(int)uVar4];
    lVar5 = (long)iVar2;
    fVar7 = -1e+09;
    uVar6 = 0;
    do {
      if (iVar2 != -1000000000) {
        iVar3 = *(int *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[uVar6]] + 0x10);
        if (((((long)iVar3 < 0) || (p->vArr->nSize <= iVar3)) || (lVar5 < 0)) ||
           (p->vEdges->nSize <= lVar5)) goto LAB_0045551b;
        fVar8 = (float)(p->vArr->pArray[iVar3] + p->vEdges->pArray[lVar5]);
        if (fVar7 < fVar8) {
          fVar7 = fVar8;
        }
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 1;
    } while (uVar1 != uVar6);
  }
  if ((-1 < (int)uVar4) && ((int)uVar4 < p->vArr->nSize)) {
    p->vArr->pArray[uVar4] = (int)fVar7;
    return fVar7;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

float Abc_BufComputeArr( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    float DelayF, Delay = -ABC_INFINITY;
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        if ( Vec_IntEntry(p->vOffsets, Abc_ObjId(pObj)) == -ABC_INFINITY )
            continue;
        DelayF = Abc_BufNodeArr(p, pFanin) + Abc_BufEdgeDelay(p, pObj, i);
        if ( Delay < DelayF )
            Delay = DelayF;
    }
    Abc_BufSetNodeArr( p, pObj, Delay );
    return Delay;
}